

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O0

void * lookup_thread_main(void *_unused)

{
  st_h2o_linklist_t *psVar1;
  int iVar2;
  h2o_hostinfo_getaddr_req_t *req;
  void *_unused_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&queue);
  do {
    queue.num_threads_idle = queue.num_threads_idle - 1;
    while( true ) {
      iVar2 = h2o_linklist_is_empty(&queue.pending);
      if (iVar2 != 0) break;
      psVar1 = queue.pending.next + -2;
      h2o_linklist_unlink(queue.pending.next);
      pthread_mutex_unlock((pthread_mutex_t *)&queue);
      lookup_and_respond((h2o_hostinfo_getaddr_req_t *)&psVar1->prev);
      pthread_mutex_lock((pthread_mutex_t *)&queue);
    }
    queue.num_threads_idle = queue.num_threads_idle + 1;
    pthread_cond_wait((pthread_cond_t *)&queue.cond,(pthread_mutex_t *)&queue);
  } while( true );
}

Assistant:

static void *lookup_thread_main(void *_unused)
{
    pthread_mutex_lock(&queue.mutex);

    while (1) {
        --queue.num_threads_idle;
        while (!h2o_linklist_is_empty(&queue.pending)) {
            h2o_hostinfo_getaddr_req_t *req = H2O_STRUCT_FROM_MEMBER(h2o_hostinfo_getaddr_req_t, _pending, queue.pending.next);
            h2o_linklist_unlink(&req->_pending);
            pthread_mutex_unlock(&queue.mutex);
            lookup_and_respond(req);
            pthread_mutex_lock(&queue.mutex);
        }
        ++queue.num_threads_idle;
        pthread_cond_wait(&queue.cond, &queue.mutex);
    }

    h2o_fatal("unreachable");
    return NULL;
}